

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::NewLine(void)

{
  ImGuiLayoutType IVar1;
  ImGuiWindow *pIVar2;
  ImGuiContext *pIVar3;
  ImVec2 local_18;
  
  pIVar3 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  if (pIVar2->SkipItems == false) {
    IVar1 = (pIVar2->DC).LayoutType;
    (pIVar2->DC).LayoutType = 1;
    if ((pIVar2->DC).CurrLineSize.y <= 0.0) {
      local_18 = (ImVec2)((ulong)(uint)pIVar3->FontSize << 0x20);
    }
    else {
      local_18.x = 0.0;
      local_18.y = 0.0;
    }
    ItemSize(&local_18,-1.0);
    (pIVar2->DC).LayoutType = IVar1;
  }
  return;
}

Assistant:

bool ImGui::DragFloat2(const char* label, float v[2], float v_speed, float v_min, float v_max, const char* format, float power)
{
    return DragScalarN(label, ImGuiDataType_Float, v, 2, v_speed, &v_min, &v_max, format, power);
}